

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

void helicsFederateInfoSetIntegerProperty
               (HelicsFederateInfo fedInfo,int integerProperty,int propertyValue,HelicsError *err)

{
  FederateInfo *this;
  
  this = getFedInfo(fedInfo,err);
  if (this != (FederateInfo *)0x0) {
    helics::CoreFederateInfo::setProperty
              (&this->super_CoreFederateInfo,integerProperty,propertyValue);
    return;
  }
  return;
}

Assistant:

void helicsFederateInfoSetIntegerProperty(HelicsFederateInfo fedInfo, int integerProperty, int propertyValue, HelicsError* err)
{
    auto* info = getFedInfo(fedInfo, err);
    if (info == nullptr) {
        return;
    }
    info->setProperty(integerProperty, propertyValue);
}